

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Catch::Detail::splitReporterSpec_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Detail *this,StringRef reporterSpec)

{
  anon_class_8_1_6310563a aVar1;
  StringRef *pSVar2;
  StringRef local_80;
  string local_70;
  size_t local_40;
  size_t nextSeparator;
  anon_class_8_1_6310563a local_30;
  anon_class_8_1_6310563a findNextSeparator;
  size_t separatorPos;
  StringRef reporterSpec_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parts;
  
  reporterSpec_local.m_start = reporterSpec.m_start;
  findNextSeparator.reporterSpec = (StringRef *)0x0;
  local_30.reporterSpec = (StringRef *)&separatorPos;
  nextSeparator._7_1_ = 0;
  separatorPos = (size_t)this;
  reporterSpec_local.m_size = (size_type)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (aVar1.reporterSpec = findNextSeparator.reporterSpec,
        pSVar2 = (StringRef *)StringRef::size((StringRef *)&separatorPos),
        aVar1.reporterSpec < pSVar2) {
    local_40 = splitReporterSpec::anon_class_8_1_6310563a::operator()
                         (&local_30,(size_t)findNextSeparator.reporterSpec);
    local_80 = StringRef::substr((StringRef *)&separatorPos,
                                 (size_type)findNextSeparator.reporterSpec,
                                 local_40 - (long)findNextSeparator.reporterSpec);
    StringRef::operator_cast_to_string(&local_70,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_40 == 0xffffffffffffffff) break;
    findNextSeparator.reporterSpec = (StringRef *)(local_40 + 2);
  }
  aVar1.reporterSpec = findNextSeparator.reporterSpec;
  pSVar2 = (StringRef *)StringRef::size((StringRef *)&separatorPos);
  if (aVar1.reporterSpec == pSVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> splitReporterSpec( StringRef reporterSpec ) {
            static constexpr auto separator = "::";
            static constexpr size_t separatorSize = 2;

            size_t separatorPos = 0;
            auto findNextSeparator = [&reporterSpec]( size_t startPos ) {
                static_assert(
                    separatorSize == 2,
                    "The code below currently assumes 2 char separator" );

                auto currentPos = startPos;
                do {
                    while ( currentPos < reporterSpec.size() &&
                            reporterSpec[currentPos] != separator[0] ) {
                        ++currentPos;
                    }
                    if ( currentPos + 1 < reporterSpec.size() &&
                         reporterSpec[currentPos + 1] == separator[1] ) {
                        return currentPos;
                    }
                    ++currentPos;
                } while ( currentPos < reporterSpec.size() );

                return static_cast<size_t>( -1 );
            };

            std::vector<std::string> parts;

            while ( separatorPos < reporterSpec.size() ) {
                const auto nextSeparator = findNextSeparator( separatorPos );
                parts.push_back( static_cast<std::string>( reporterSpec.substr(
                    separatorPos, nextSeparator - separatorPos ) ) );

                if ( nextSeparator == static_cast<size_t>( -1 ) ) {
                    break;
                }
                separatorPos = nextSeparator + separatorSize;
            }

            // Handle a separator at the end.
            // This is not a valid spec, but we want to do validation in a
            // centralized place
            if ( separatorPos == reporterSpec.size() ) {
                parts.emplace_back();
            }

            return parts;
        }